

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O2

void bitset_container_add_from_range
               (bitset_container_t *bitset,uint32_t min,uint32_t max,uint16_t step)

{
  uint64_t *puVar1;
  int iVar2;
  undefined6 in_register_0000000a;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  
  iVar2 = (int)CONCAT62(in_register_0000000a,step);
  if (iVar2 != 0) {
    uVar3 = (ulong)min;
    if ((short)(0x40 % (uint)step) == 0) {
      uVar5 = 0;
      for (uVar3 = uVar3 % (ulong)step; uVar3 < 0x40; uVar3 = uVar3 + step) {
        uVar5 = uVar5 | 1L << (uVar3 & 0x3f);
      }
      uVar3 = (ulong)(min >> 6);
      uVar8 = max - 1 >> 6;
      bitset->cardinality =
           (int32_t)((ulong)(iVar2 + max + ~min) /
                    (CONCAT62(in_register_0000000a,step) & 0xffffffff));
      uVar4 = -1L << ((byte)min & 0x3f);
      if (min >> 6 == uVar8) {
        bVar6 = -(char)max;
        bitset->words[uVar3] =
             bitset->words[uVar3] | (uVar4 << (bVar6 & 0x3f)) >> (bVar6 & 0x3f) & uVar5;
        return;
      }
      puVar1 = bitset->words;
      puVar1[uVar3] = uVar4 & uVar5;
      while (uVar3 = uVar3 + 1, uVar3 < uVar8) {
        puVar1[uVar3] = uVar5;
      }
      bVar6 = -(char)max;
      puVar1[uVar8] = (uVar5 << (bVar6 & 0x3f)) >> (bVar6 & 0x3f);
      return;
    }
    for (; (uint)uVar3 < max; uVar3 = (ulong)((uint)uVar3 + iVar2)) {
      uVar4 = (ulong)((uint)(uVar3 >> 3) & 0x1ff8);
      uVar5 = *(ulong *)((long)bitset->words + uVar4);
      uVar7 = uVar5 | 1L << (uVar3 & 0x3f);
      bitset->cardinality = bitset->cardinality + (int)((uVar5 ^ uVar7) >> ((byte)uVar3 & 0x3f));
      *(ulong *)((long)bitset->words + uVar4) = uVar7;
    }
  }
  return;
}

Assistant:

void bitset_container_add_from_range(bitset_container_t *bitset, uint32_t min,
                                     uint32_t max, uint16_t step) {
    if (step == 0) return;   // refuse to crash
    if ((64 % step) == 0) {  // step divides 64
        uint64_t mask = 0;   // construct the repeated mask
        for (uint32_t value = (min % step); value < 64; value += step) {
            mask |= ((uint64_t)1 << value);
        }
        uint32_t firstword = min / 64;
        uint32_t endword = (max - 1) / 64;
        bitset->cardinality = (max - min + step - 1) / step;
        if (firstword == endword) {
            bitset->words[firstword] |=
                mask & (((~UINT64_C(0)) << (min % 64)) &
                        ((~UINT64_C(0)) >> ((~max + 1) % 64)));
            return;
        }
        bitset->words[firstword] = mask & ((~UINT64_C(0)) << (min % 64));
        for (uint32_t i = firstword + 1; i < endword; i++)
            bitset->words[i] = mask;
        bitset->words[endword] = mask & ((~UINT64_C(0)) >> ((~max + 1) % 64));
    } else {
        for (uint32_t value = min; value < max; value += step) {
            bitset_container_add(bitset, value);
        }
    }
}